

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FILongValueImpl::~FILongValueImpl(FILongValueImpl *this)

{
  ~FILongValueImpl(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

inline FILongValueImpl(std::vector<int64_t> &&value_): strValueValid(false) { value = std::move(value_); }